

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string *
pugi::impl::anon_unknown_0::string_value
          (xpath_string *__return_storage_ptr__,xpath_node *na,xpath_allocator *alloc)

{
  bool bVar1;
  xml_node_type xVar2;
  unspecified_bool_type p_Var3;
  char_t *pcVar4;
  unspecified_bool_type p_Var5;
  bool local_b6;
  bool local_b5;
  xpath_string *result;
  xml_node local_90;
  xml_node_struct *local_88;
  xml_node local_80;
  xml_node_struct *local_78;
  xml_node local_70;
  xpath_string local_68;
  xml_node local_50;
  xml_node cur;
  xml_node local_30;
  xml_node n;
  xml_attribute local_20;
  xpath_allocator *local_18;
  xpath_allocator *alloc_local;
  xpath_node *na_local;
  
  local_18 = alloc;
  alloc_local = (xpath_allocator *)na;
  local_20 = xpath_node::attribute(na);
  p_Var3 = xml_attribute::operator_cast_to_function_pointer(&local_20);
  if (p_Var3 == (unspecified_bool_type)0x0) {
    local_30 = xpath_node::node((xpath_node *)alloc_local);
    xVar2 = xml_node::type(&local_30);
    if (xVar2 - node_document < 2) {
      xpath_string::xpath_string(__return_storage_ptr__);
      pcVar4 = xml_node::value(&local_30);
      if (*pcVar4 != '\0') {
        pcVar4 = xml_node::value(&local_30);
        xpath_string::from_const((xpath_string *)&cur,pcVar4);
        xpath_string::append(__return_storage_ptr__,(xpath_string *)&cur,local_18);
      }
      local_50 = xml_node::first_child(&local_30);
      while( true ) {
        p_Var5 = xml_node::operator_cast_to_function_pointer(&local_50);
        local_b5 = false;
        if (p_Var5 != (unspecified_bool_type)0x0) {
          local_b5 = xml_node::operator!=(&local_50,&local_30);
        }
        if (local_b5 == false) break;
        xVar2 = xml_node::type(&local_50);
        if ((xVar2 == node_pcdata) || (xVar2 = xml_node::type(&local_50), xVar2 == node_cdata)) {
          pcVar4 = xml_node::value(&local_50);
          xpath_string::from_const(&local_68,pcVar4);
          xpath_string::append(__return_storage_ptr__,&local_68,local_18);
        }
        local_70 = xml_node::first_child(&local_50);
        p_Var5 = xml_node::operator_cast_to_function_pointer(&local_70);
        if (p_Var5 == (unspecified_bool_type)0x0) {
          local_80 = xml_node::next_sibling(&local_50);
          p_Var5 = xml_node::operator_cast_to_function_pointer(&local_80);
          if (p_Var5 == (unspecified_bool_type)0x0) {
            while( true ) {
              local_90 = xml_node::next_sibling(&local_50);
              bVar1 = xml_node::operator!(&local_90);
              local_b6 = false;
              if (bVar1) {
                local_b6 = xml_node::operator!=(&local_50,&local_30);
              }
              if (local_b6 == false) break;
              local_50 = xml_node::parent(&local_50);
            }
            bVar1 = xml_node::operator!=(&local_50,&local_30);
            if (bVar1) {
              local_50 = xml_node::next_sibling(&local_50);
            }
          }
          else {
            local_88 = (xml_node_struct *)xml_node::next_sibling(&local_50);
            local_50 = (xml_node)local_88;
          }
        }
        else {
          local_78 = (xml_node_struct *)xml_node::first_child(&local_50);
          local_50 = (xml_node)local_78;
        }
      }
    }
    else if (xVar2 - node_pcdata < 4) {
      pcVar4 = xml_node::value(&local_30);
      xpath_string::from_const(__return_storage_ptr__,pcVar4);
    }
    else {
      xpath_string::xpath_string(__return_storage_ptr__);
    }
  }
  else {
    n._root = (xml_node_struct *)xpath_node::attribute((xpath_node *)alloc_local);
    pcVar4 = xml_attribute::value((xml_attribute *)&n);
    xpath_string::from_const(__return_storage_ptr__,pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xpath_string string_value(const xpath_node& na, xpath_allocator* alloc)
	{
		if (na.attribute())
			return xpath_string::from_const(na.attribute().value());
		else
		{
			xml_node n = na.node();

			switch (n.type())
			{
			case node_pcdata:
			case node_cdata:
			case node_comment:
			case node_pi:
				return xpath_string::from_const(n.value());

			case node_document:
			case node_element:
			{
				xpath_string result;

				// element nodes can have value if parse_embed_pcdata was used
				if (n.value()[0])
					result.append(xpath_string::from_const(n.value()), alloc);

				xml_node cur = n.first_child();

				while (cur && cur != n)
				{
					if (cur.type() == node_pcdata || cur.type() == node_cdata)
						result.append(xpath_string::from_const(cur.value()), alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();

						if (cur != n) cur = cur.next_sibling();
					}
				}

				return result;
			}

			default:
				return xpath_string();
			}
		}
	}